

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void freeCursorWithCache(Vdbe *p,VdbeCursor *pCx)

{
  VdbeTxtBlbCache *p_00;
  
  p_00 = pCx->pCache;
  pCx->field_0x5 = pCx->field_0x5 & 0xef;
  pCx->pCache = (VdbeTxtBlbCache *)0x0;
  if (p_00->pCValue != (char *)0x0) {
    sqlite3RCStrUnref(p_00->pCValue);
    p_00->pCValue = (char *)0x0;
  }
  sqlite3DbFreeNN(p->db,p_00);
  sqlite3VdbeFreeCursorNN(p,pCx);
  return;
}

Assistant:

static SQLITE_NOINLINE void freeCursorWithCache(Vdbe *p, VdbeCursor *pCx){
  VdbeTxtBlbCache *pCache = pCx->pCache;
  assert( pCx->colCache );
  pCx->colCache = 0;
  pCx->pCache = 0;
  if( pCache->pCValue ){
    sqlite3RCStrUnref(pCache->pCValue);
    pCache->pCValue = 0;
  }
  sqlite3DbFree(p->db, pCache);
  sqlite3VdbeFreeCursorNN(p, pCx);
}